

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
tf::TFProfManager::_manage(TFProfManager *this,shared_ptr<tf::TFProfObserver> *observer)

{
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,in_RDI);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::push_back(in_RSI,(value_type *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1329e8);
  return;
}

Assistant:

inline void TFProfManager::_manage(std::shared_ptr<TFProfObserver> observer) {
  std::lock_guard lock(_mutex);
  _observers.push_back(std::move(observer));
}